

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::ImulExtendedCaseInstance::getInputValues
          (ImulExtendedCaseInstance *this,int numValues,void **values)

{
  undefined4 uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  Random rnd;
  
  dVar5 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar5 ^ 0x224fa1);
  uVar6 = glu::getDataTypeScalarSize
                    ((((this->super_IntegerFunctionTestInstance).m_spec.inputs.
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  pvVar2 = *values;
  pvVar3 = values[1];
  iVar14 = 0;
  uVar12 = 0;
  if (0 < (int)uVar6) {
    uVar12 = (ulong)uVar6;
  }
  for (lVar11 = 0; uVar13 = uVar12, iVar10 = iVar14, lVar11 != 7; lVar11 = lVar11 + 1) {
    while (uVar13 != 0) {
      uVar1 = (&DAT_009cf604)[lVar11 * 2];
      *(undefined4 *)((long)pvVar2 + (long)iVar10 * 4) = (&DAT_009cf600)[lVar11 * 2];
      *(undefined4 *)((long)pvVar3 + (long)iVar10 * 4) = uVar1;
      uVar13 = uVar13 - 1;
      iVar10 = iVar10 + 1;
    }
    iVar14 = iVar14 + uVar6;
  }
  iVar10 = uVar6 * 7;
  for (iVar14 = 7; uVar13 = uVar12, iVar4 = iVar10, iVar14 < numValues; iVar14 = iVar14 + 1) {
    while (uVar13 != 0) {
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      dVar8 = deRandom_getUint32(&rnd.m_rnd);
      dVar9 = deRandom_getUint32(&rnd.m_rnd);
      *(int *)((long)pvVar2 + (long)iVar4 * 4) = (int)dVar5 >> (sbyte)((ulong)dVar8 % 0x15);
      *(int *)((long)pvVar3 + (long)iVar4 * 4) = (int)dVar7 >> (sbyte)((ulong)dVar9 % 0x15);
      uVar13 = uVar13 - 1;
      iVar4 = iVar4 + 1;
    }
    iVar10 = iVar10 + uVar6;
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0x224fa1u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
//		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		deUint32*				in0			= (deUint32*)values[0];
		deUint32*				in1			= (deUint32*)values[1];
		int						valueNdx	= 0;

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0xffffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x00000001u },
			{ 0x7fffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x7fffffffu },
			{ 0xffffffffu,	0xffffffffu },
			{ 0x7fffffffu,	0xfffffffeu },
		};

		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].x;
				in1[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].y;
			}

			valueNdx += 1;
		}

		while (valueNdx < numValues)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const deInt32	base0	= (deInt32)rnd.getUint32();
				const deInt32	base1	= (deInt32)rnd.getUint32();
				const int		adj0	= rnd.getInt(0, 20);
				const int		adj1	= rnd.getInt(0, 20);
				in0[valueNdx*scalarSize + compNdx] = base0 >> adj0;
				in1[valueNdx*scalarSize + compNdx] = base1 >> adj1;
			}

			valueNdx += 1;
		}
	}